

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-pool.c
# Opt level: O0

MMDB_data_pool_s * data_pool_new(size_t size)

{
  _Bool _Var1;
  MMDB_data_pool_s *pool_00;
  MMDB_entry_data_list_s *pMVar2;
  MMDB_data_pool_s *pool;
  size_t size_local;
  
  pool_00 = (MMDB_data_pool_s *)calloc(1,0x220);
  if (pool_00 != (MMDB_data_pool_s *)0x0) {
    if ((size != 0) && (_Var1 = can_multiply(0xffffffffffffffff,size,0x40), _Var1)) {
      pool_00->size = size;
      pMVar2 = (MMDB_entry_data_list_s *)calloc(pool_00->size,0x40);
      pool_00->blocks[0] = pMVar2;
      if (pool_00->blocks[0] != (MMDB_entry_data_list_s *)0x0) {
        pool_00->blocks[0]->pool = pool_00;
        pool_00->sizes[0] = size;
        pool_00->block = pool_00->blocks[0];
        return pool_00;
      }
      data_pool_destroy(pool_00);
      return (MMDB_data_pool_s *)0x0;
    }
    data_pool_destroy(pool_00);
  }
  return (MMDB_data_pool_s *)0x0;
}

Assistant:

MMDB_data_pool_s *data_pool_new(size_t const size) {
    MMDB_data_pool_s *const pool = calloc(1, sizeof(MMDB_data_pool_s));
    if (!pool) {
        return NULL;
    }

    if (size == 0 ||
        !can_multiply(SIZE_MAX, size, sizeof(MMDB_entry_data_list_s))) {
        data_pool_destroy(pool);
        return NULL;
    }
    pool->size = size;
    pool->blocks[0] = calloc(pool->size, sizeof(MMDB_entry_data_list_s));
    if (!pool->blocks[0]) {
        data_pool_destroy(pool);
        return NULL;
    }
    pool->blocks[0]->pool = pool;

    pool->sizes[0] = size;

    pool->block = pool->blocks[0];

    return pool;
}